

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLbitset.c
# Opt level: O1

void RDL_swap_columns(uchar **rows,uint nof_rows,uint col1,uint col2)

{
  uchar *puVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  
  if (nof_rows != 0) {
    bVar2 = (byte)col1 & 7;
    bVar3 = (byte)col2 & 7;
    uVar4 = 0;
    do {
      puVar1 = rows[uVar4];
      if (((puVar1[col2 >> 3] >> bVar3 ^ puVar1[col1 >> 3] >> bVar2) & 1) != 0) {
        puVar1[col1 >> 3] = puVar1[col1 >> 3] ^ (byte)(1 << bVar2);
        rows[uVar4][col2 >> 3] = rows[uVar4][col2 >> 3] ^ (byte)(1 << bVar3);
      }
      uVar4 = uVar4 + 1;
    } while (nof_rows != uVar4);
  }
  return;
}

Assistant:

void RDL_swap_columns(unsigned char** rows, unsigned nof_rows, unsigned col1, unsigned col2)
{
  unsigned char val1, val2;
  unsigned i;

  for (i = 0; i < nof_rows; ++i) {
    val1 = RDL_bitset_test(rows[i], col1);
    val2 = RDL_bitset_test(rows[i], col2);

    if (!val1 != !val2) {
      RDL_bitset_flip(rows[i], col1);
      RDL_bitset_flip(rows[i], col2);
    }
  }
}